

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

void flatbuffers::php::PhpGenerator::BuildVectorOfTable(FieldDef *field,string *code_ptr)

{
  size_t t;
  size_t t_00;
  Type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  BaseType local_70;
  undefined4 local_6c;
  Parser *local_68;
  EnumDef *pEStack_60;
  uint16_t local_58;
  BaseType local_50;
  BaseType local_4c;
  StructDef *local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  
  local_50 = (field->value).type.element;
  local_38 = (field->value).type.fixed_length;
  local_4c = BASE_TYPE_NONE;
  local_48 = (field->value).type.struct_def;
  uStack_40 = (field->value).type.enum_def;
  t = InlineAlignment((Type *)&stack0xffffffffffffffb0);
  t_00 = InlineSize((Type *)&stack0xffffffffffffffb0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," * @param FlatBufferBuilder $builder\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," * @param array offset array\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," * @return int vector offset\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," */\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"public static function create");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  ConvertCase(&local_b0,(string *)field,kUpperCamel,kSnake);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  std::operator+(&local_b0,&local_90,"$builder->startVector(");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  NumToString<unsigned_long>(&local_b0,t_00);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  NumToString<unsigned_long>(&local_90,t);
  std::operator+(&local_b0,", count($data), ",&local_90);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::append((char *)code_ptr);
  if ((field->value).type.element - BASE_TYPE_UTYPE < 0xc) {
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::operator+(&local_b0,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::append((char *)code_ptr);
    local_70 = (field->value).type.element;
    local_58 = (field->value).type.fixed_length;
    local_6c = 0;
    local_68 = (Parser *)(field->value).type.struct_def;
    pEStack_60 = (field->value).type.enum_def;
    GenTypeBasic_abi_cxx11_(&local_90,(PhpGenerator *)&stack0xffffffffffffff90,type);
    ConvertCase(&local_b0,&local_90,kUpperCamel,kSnake);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::operator+(&local_b0,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  std::operator+(&local_b0,&local_90,"}\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  std::operator+(&local_b0,&local_90,"return $builder->endVector();\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," * @param FlatBufferBuilder $builder\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," * @param int $numElems\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," * @return void\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," */\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"public static function start");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  ConvertCase(&local_b0,(string *)field,kUpperCamel,kSnake);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  std::operator+(&local_b0,&local_90,"$builder->startVector(");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  NumToString<unsigned_long>(&local_b0,t_00);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  NumToString<unsigned_long>(&local_90,t);
  std::operator+(&local_b0,", $numElems, ",&local_90);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

static void BuildVectorOfTable(const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;

    auto vector_type = field.value.type.VectorType();
    auto alignment = InlineAlignment(vector_type);
    auto elem_size = InlineSize(vector_type);
    code += Indent + "/**\n";
    code += Indent + " * @param FlatBufferBuilder $builder\n";
    code += Indent + " * @param array offset array\n";
    code += Indent + " * @return int vector offset\n";
    code += Indent + " */\n";
    code += Indent + "public static function create";
    code += ConvertCase(field.name, Case::kUpperCamel);
    code += "Vector(FlatBufferBuilder $builder, array $data)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$builder->startVector(";
    code += NumToString(elem_size);
    code += ", count($data), " + NumToString(alignment);
    code += ");\n";
    code += Indent + Indent;
    code += "for ($i = count($data) - 1; $i >= 0; $i--) {\n";
    if (IsScalar(field.value.type.VectorType().base_type)) {
      code += Indent + Indent + Indent;
      code += "$builder->put";
      code += ConvertCase(GenTypeBasic(field.value.type.VectorType()),
                          Case::kUpperCamel);
      code += "($data[$i]);\n";
    } else {
      code += Indent + Indent + Indent;
      code += "$builder->putOffset($data[$i]);\n";
    }
    code += Indent + Indent + "}\n";
    code += Indent + Indent + "return $builder->endVector();\n";
    code += Indent + "}\n\n";

    code += Indent + "/**\n";
    code += Indent + " * @param FlatBufferBuilder $builder\n";
    code += Indent + " * @param int $numElems\n";
    code += Indent + " * @return void\n";
    code += Indent + " */\n";
    code += Indent + "public static function start";
    code += ConvertCase(field.name, Case::kUpperCamel);
    code += "Vector(FlatBufferBuilder $builder, $numElems)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$builder->startVector(";
    code += NumToString(elem_size);
    code += ", $numElems, " + NumToString(alignment);
    code += ");\n";
    code += Indent + "}\n\n";
  }